

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O3

int __thiscall
TPZFMatrix<double>::Decompose_LU
          (TPZFMatrix<double> *this,list<long,_std::allocator<long>_> *singular)

{
  size_t *psVar1;
  ulong uVar2;
  long lVar3;
  double *pdVar4;
  byte bVar5;
  _List_node_base *p_Var6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  _List_node_base *p_Var13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  double extraout_XMM0_Qa;
  double dVar18;
  double extraout_XMM0_Qa_00;
  long local_a8;
  undefined8 local_38;
  
  bVar5 = (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed;
  if (1 < bVar5) {
    Error("Decompose_LU <Matrix already Decomposed with other scheme>",(char *)0x0);
    bVar5 = (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed;
  }
  if (bVar5 == 0) {
    uVar15 = (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    uVar2 = (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
    uVar8 = uVar15;
    if ((long)uVar2 < (long)uVar15) {
      uVar8 = uVar2;
    }
    if (0 < (int)(uint)uVar8) {
      iVar14 = (int)uVar15;
      uVar17 = uVar15 & 0xffffffff;
      uVar16 = 1;
      lVar11 = 8;
      local_a8 = 0;
      p_Var13 = (_List_node_base *)0x0;
      do {
        (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
          [0x24])(this,p_Var13,p_Var13);
        dVar18 = extraout_XMM0_Qa;
        if (ABS(extraout_XMM0_Qa) < 1e-12) {
          p_Var6 = (_List_node_base *)operator_new(0x18);
          p_Var6[1]._M_next = p_Var13;
          std::__detail::_List_node_base::_M_hook(p_Var6);
          psVar1 = &(singular->super__List_base<long,_std::allocator<long>_>)._M_impl._M_node.
                    _M_size;
          *psVar1 = *psVar1 + 1;
          local_38 = 0x3ff0000000000000;
          (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0x23])(this,p_Var13,p_Var13,&local_38);
          dVar18 = 1.0;
        }
        p_Var6 = (_List_node_base *)((long)&p_Var13->_M_next + 1);
        if ((long)p_Var6 < (long)iVar14) {
          lVar12 = (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
          uVar10 = uVar16;
          do {
            if ((lVar12 <= (long)uVar10) ||
               ((this->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= (long)p_Var13)) {
              Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar9 = local_a8 * lVar12;
            *(double *)((long)this->fElem + uVar10 * 8 + lVar9) =
                 *(double *)((long)this->fElem + uVar10 * 8 + lVar9) / dVar18;
            uVar10 = uVar10 + 1;
          } while (uVar17 != uVar10);
        }
        lVar12 = lVar11;
        uVar10 = uVar16;
        if ((long)p_Var6 < (long)(int)uVar2) {
          do {
            lVar9 = (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
            lVar3 = (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
            if (lVar3 <= (long)uVar10 || lVar9 <= (long)p_Var6) {
              Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            pdVar4 = this->fElem;
            if ((lVar9 <= (long)p_Var6) || (lVar3 <= (long)p_Var13)) {
              Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
              [0x24])(this,p_Var13,uVar10);
            if ((long)p_Var6 < (long)iVar14) {
              lVar3 = lVar9 * lVar12 + local_a8;
              lVar7 = 1;
              do {
                *(double *)((long)pdVar4 + lVar7 * 8 + lVar3) =
                     *(double *)((long)pdVar4 + lVar7 * 8 + lVar3) -
                     *(double *)((long)pdVar4 + lVar7 * 8 + (lVar9 + 1) * local_a8) *
                     extraout_XMM0_Qa_00;
                lVar7 = lVar7 + 1;
              } while ((int)uVar15 != (int)lVar7);
            }
            uVar10 = uVar10 + 1;
            lVar12 = lVar12 + 8;
          } while (uVar10 != (uVar2 & 0xffffffff));
        }
        uVar16 = uVar16 + 1;
        local_a8 = local_a8 + 8;
        lVar11 = lVar11 + 8;
        uVar15 = uVar15 - 1;
        p_Var13 = p_Var6;
      } while (p_Var6 != (_List_node_base *)(ulong)((uint)uVar8 & 0x7fffffff));
    }
    (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed = '\x01';
  }
  return 1;
}

Assistant:

int TPZFMatrix<TVar>::Decompose_LU(std::list<int64_t> &singular) {
    //return Decompose_LU();
#ifndef USING_LAPACK
    if (  this->fDecomposed && this->fDecomposed != ELU)  Error( "Decompose_LU <Matrix already Decomposed with other scheme>" );
#else
    if (  this->fDecomposed && this->fDecomposed != ELUPivot)  Error( "Decompose_LU <Matrix already Decomposed with other scheme>" );
#endif
    if (this->fDecomposed) return 1;
    
    const int  min = ( this->Cols() < (this->Rows()) ) ? this->Cols() : this->Rows();
    const int nrows = this->Rows();
    const int ncols = this->Cols();
    
    for ( int k = 0; k < min ; k++ ) {
        TVar pivot = GetVal(k, k);
        if (IsZero( pivot )){
            singular.push_back(k);
            PutVal(k,k,1.);
            pivot = 1.;
        }
        for ( int i = k+1; i < nrows; i++ ) {
            this->operator()(i,k) /= pivot;
        }
        for ( int j = k+1; j < ncols; j++ ){
            int i = k+1;
            TVar * elemPtr = &(this->operator()(i,j));
            TVar * ikPtr = &(this->operator()(i,k));
            const TVar kjVal = GetVal(k,j);
            for ( ; i < nrows; i++, elemPtr++, ikPtr++ ) {
                (*elemPtr) -= (*ikPtr)*kjVal;
                //          this->operator()(i,j) -= GetVal( i, k )*GetVal(k,j);
            }
        }
    }
    this->fDecomposed=ELU;
#ifdef USING_LAPACK
    fPivot.resize(nrows);
    for (int i=0; i<nrows; i++) {
        fPivot[i] = i+1;
    }
    this->fDecomposed = ELUPivot;
#endif //USING_LAPACK
    return 1;
}